

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O1

int pcap_getnonblock(pcap_t *p,char *errbuf)

{
  int iVar1;
  
  iVar1 = (*p->getnonblock_op)(p,errbuf);
  if (iVar1 == -1) {
    strncpy(p->errbuf,errbuf,0x100);
    p->errbuf[0xff] = '\0';
  }
  return iVar1;
}

Assistant:

int
pcap_getnonblock(pcap_t *p, char *errbuf)
{
	int ret;

	ret = p->getnonblock_op(p, errbuf);
	if (ret == -1) {
		/*
		 * In case somebody depended on the bug wherein
		 * the error message was put into p->errbuf
		 * by pcap_getnonblock_fd().
		 */
		strlcpy(p->errbuf, errbuf, PCAP_ERRBUF_SIZE);
	}
	return (ret);
}